

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O0

MusInfo * GME_OpenSong(FileReader *reader,char *fmt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  gme_type_t pgVar4;
  Music_Emu *emu_00;
  long lVar5;
  Music_Emu *me;
  undefined4 extraout_var;
  gme_err_t pcVar6;
  float extraout_XMM0_Da;
  Music_Emu *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  int len;
  int fpos;
  int sample_rate;
  Music_Emu *emu;
  BYTE *song;
  gme_err_t err;
  gme_type_t type;
  char *fmt_local;
  FileReader *reader_local;
  
  pgVar4 = gme_identify_extension(in_stack_ffffffffffffff98);
  if (pgVar4 == (gme_type_t)0x0) {
    reader_local = (FileReader *)0x0;
  }
  else {
    (*GSnd->_vptr_SoundRenderer[10])();
    emu_00 = gme_new_emu((gme_type_t)emu,sample_rate);
    if (emu_00 == (Music_Emu *)0x0) {
      reader_local = (FileReader *)0x0;
    }
    else {
      iVar1 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[3])();
      lVar5 = FileReader::GetLength(reader);
      iVar2 = (int)lVar5;
      me = (Music_Emu *)operator_new__((long)iVar2);
      iVar3 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,me,(long)iVar2);
      if (CONCAT44(extraout_var,iVar3) == (long)iVar2) {
        pcVar6 = gme_load_data((Music_Emu *)song,me,(long)emu_00);
        if (me != (Music_Emu *)0x0) {
          operator_delete__(me);
        }
        if (pcVar6 == (gme_err_t)0x0) {
          reader_local = (FileReader *)operator_new(0x38);
          GMESong::GMESong((GMESong *)reader_local,emu_00,(int)extraout_XMM0_Da);
        }
        else {
          Printf("Failed loading song: %s\n",pcVar6);
          gme_delete(me);
          (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,(long)iVar1,0);
          reader_local = (FileReader *)0x0;
        }
      }
      else {
        if (me != (Music_Emu *)0x0) {
          operator_delete__(me);
        }
        gme_delete(in_stack_ffffffffffffff90);
        (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,(long)iVar1,0);
        reader_local = (FileReader *)0x0;
      }
    }
  }
  return (MusInfo *)reader_local;
}

Assistant:

MusInfo *GME_OpenSong(FileReader &reader, const char *fmt)
{
	gme_type_t type;
	gme_err_t err;
	BYTE *song;
	Music_Emu *emu;
	int sample_rate;
	
	type = gme_identify_extension(fmt);
	if (type == NULL)
	{
		return NULL;
	}
	sample_rate = (int)GSnd->GetOutputRate();
	emu = gme_new_emu(type, sample_rate);
	if (emu == NULL)
	{
		return NULL;
	}

    int fpos = reader.Tell();
    int len = reader.GetLength();
    song = new BYTE[len];
    if (reader.Read(song, len) != len)
    {
        delete[] song;
        gme_delete(emu);
        reader.Seek(fpos, SEEK_SET);
        return NULL;
    }

	err = gme_load_data(emu, song, len);
    delete[] song;

	if (err != NULL)
	{
		Printf("Failed loading song: %s\n", err);
		gme_delete(emu);
        reader.Seek(fpos, SEEK_SET);
		return NULL;
	}
	return new GMESong(emu, sample_rate);
}